

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_29623::ReEscapeStrings::visit(ReEscapeStrings *this,LiteralString *lit)

{
  bool bVar1;
  reference pcVar2;
  long in_RSI;
  bool bVar3;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_stack_00000008;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_stack_00000010;
  bool use_single;
  char32_t c;
  iterator __end2;
  iterator __begin2;
  UString *__range2;
  uint num_double;
  uint num_single;
  bool in_stack_000001f7;
  UString *in_stack_000001f8;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar4;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_28;
  long local_20;
  int local_18;
  int local_14;
  long local_10;
  
  if (*(int *)(in_RSI + 0xa0) == 5) {
    local_14 = 0;
    local_18 = 0;
    local_20 = in_RSI + 0x80;
    local_10 = in_RSI;
    local_28._M_current =
         (char32_t *)
         std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
         ::begin(in_stack_ffffffffffffffa8);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::end
              (in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98), bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
               ::operator*(&local_28);
      if (*pcVar2 == L'\'') {
        local_14 = local_14 + 1;
      }
      if (*pcVar2 == L'\"') {
        local_18 = local_18 + 1;
      }
      __gnu_cxx::
      __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
      ::operator++(&local_28);
    }
    bVar1 = local_18 != 0;
    bVar3 = local_14 == 0;
    uVar4 = bVar1 && bVar3;
    jsonnet::internal::jsonnet_string_escape(in_stack_000001f8,in_stack_000001f7);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(in_stack_00000010,in_stack_00000008);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               CONCAT17(uVar4,in_stack_ffffffffffffffa0));
    *(uint *)(local_10 + 0xa0) = (uint)(!bVar1 || !bVar3);
  }
  return;
}

Assistant:

void visit(LiteralString *lit)
    {
        if (lit->tokenKind != LiteralString::RAW_DESUGARED)
            return;

        // TODO: Share code with formatter.cpp EnforceStringStyle.
        unsigned num_single = 0, num_double = 0;
        for (char32_t c : lit->value) {
            if (c == '\'')
                num_single++;
            if (c == '"')
                num_double++;
        }
        bool use_single = (num_double > 0) && (num_single == 0);

        lit->value = jsonnet_string_escape(lit->value, use_single);
        lit->tokenKind = use_single ? LiteralString::SINGLE : LiteralString::DOUBLE;
    }